

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O1

void __thiscall
flow::BinaryInstr<(flow::BinaryOperator)20,_(flow::LiteralType)3>::BinaryInstr
          (BinaryInstr<(flow::BinaryOperator)20,_(flow::LiteralType)3> *this,Value *lhs,Value *rhs,
          string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator_type local_41;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_40;
  Value *local_28;
  Value *local_20;
  
  __l._M_len = 2;
  __l._M_array = &local_28;
  local_28 = lhs;
  local_20 = rhs;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_40,__l,&local_41);
  Instr::Instr(&this->super_Instr,String,&local_40,name);
  if (local_40.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__Instr_00195ba0;
  this->operator_ = SAdd;
  return;
}

Assistant:

BinaryInstr(Value* lhs, Value* rhs, const std::string& name)
      : Instr(ResultType, {lhs, rhs}, name), operator_(Operator) {}